

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_band.c
# Opt level: O0

int check_matrix_entry(SUNMatrix A,sunrealtype val,sunrealtype tol)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  sunrealtype *Acolj;
  sunindextype iend;
  sunindextype istart;
  sunindextype j;
  sunindextype i;
  int failure;
  long local_80;
  long local_68;
  long local_38;
  long local_30;
  int local_24;
  uint local_4;
  
  local_24 = 0;
  for (local_38 = 0; lVar2 = SUNBandMatrix_Columns(in_RDI), local_38 < lVar2;
      local_38 = local_38 + 1) {
    lVar2 = SUNBandMatrix_Column(in_RDI,local_38);
    lVar3 = SUNBandMatrix_UpperBandwidth(in_RDI);
    local_68 = local_38;
    if (lVar3 <= local_38) {
      local_68 = SUNBandMatrix_UpperBandwidth(in_RDI);
    }
    local_68 = -local_68;
    lVar3 = SUNBandMatrix_Columns(in_RDI);
    lVar4 = SUNBandMatrix_LowerBandwidth(in_RDI);
    if ((lVar3 + -1) - lVar4 < local_38) {
      lVar3 = SUNBandMatrix_Columns(in_RDI);
      local_80 = (lVar3 + -1) - local_38;
    }
    else {
      local_80 = SUNBandMatrix_LowerBandwidth(in_RDI);
    }
    for (local_30 = local_68; local_30 <= local_80; local_30 = local_30 + 1) {
      iVar1 = SUNRCompareTol(*(undefined8 *)(lVar2 + local_30 * 8),in_XMM0_Qa,in_XMM1_Qa);
      if (iVar1 != 0) {
        local_24 = local_24 + 1;
        printf("j = %li, Acolj[%li] = %g, val = %g\n",*(undefined8 *)(lVar2 + local_30 * 8),local_38
               ,local_30);
      }
    }
  }
  local_4 = (uint)(0.0 < (double)local_24);
  return local_4;
}

Assistant:

int check_matrix_entry(SUNMatrix A, sunrealtype val, sunrealtype tol)
{
  int failure = 0;
  sunindextype i, j, istart, iend;
  sunrealtype* Acolj;

  /* check matrix data */
  for (j = 0; j < SUNBandMatrix_Columns(A); j++)
  {
    /* access matrix column */
    Acolj = SUNBandMatrix_Column(A, j);

    /* compare entries in this column */
    istart = (j < SUNBandMatrix_UpperBandwidth(A))
               ? -j
               : -SUNBandMatrix_UpperBandwidth(A);
    iend = (j > SUNBandMatrix_Columns(A) - 1 - SUNBandMatrix_LowerBandwidth(A))
             ? SUNBandMatrix_Columns(A) - 1 - j
             : SUNBandMatrix_LowerBandwidth(A);
    for (i = istart; i <= iend; i++)
    {
      if (SUNRCompareTol(Acolj[i], val, tol))
      {
        failure++;
        printf("j = %li, Acolj[%li] = %" GSYM ", val = %" GSYM "\n",
               (long int)j, (long int)i, Acolj[i], val);
      }
    }
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}